

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_env_cwalk(mdb_copy *my,pgno_t *pg,int flags)

{
  MDB_page *pMVar1;
  undefined8 *puVar2;
  MDB_env *pMVar3;
  char *pcVar4;
  pgno_t pVar5;
  MDB_page *pMVar6;
  uint6 uVar7;
  void *pvVar8;
  unsigned_short uVar9;
  int iVar10;
  MDB_page *dst;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  MDB_page *mp;
  MDB_db db;
  int local_22c;
  MDB_page *local_228;
  uint local_21c;
  MDB_page *local_218;
  char *local_210;
  long local_208;
  long local_200;
  ulong local_1f8;
  anon_union_8_2_b62042e6_for_mp_p *local_1f0;
  void *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  pgno_t pStack_1c0;
  MDB_cursor local_1b8;
  
  if ((MDB_page **)*pg == (MDB_page **)0xffffffffffffffff) {
    iVar10 = 0;
  }
  else {
    local_1b8.mc_snum = 1;
    local_1b8.mc_top = 0;
    local_1b8.mc_txn = my->mc_txn;
    iVar10 = mdb_page_get((MDB_cursor *)local_1b8.mc_txn,(pgno_t)pg,(MDB_page **)*pg,
                          (int *)local_1b8.mc_pg);
    if ((iVar10 == 0) &&
       (iVar10 = mdb_page_search_root(&local_1b8,(MDB_val *)0x0,4), uVar9 = local_1b8.mc_snum,
       iVar10 == 0)) {
      pMVar3 = my->mc_env;
      uVar13 = pMVar3->me_psize;
      uVar17 = (ulong)uVar13;
      dst = (MDB_page *)malloc((ulong)(uVar13 * local_1b8.mc_snum));
      if (dst == (MDB_page *)0x0) {
        iVar10 = 0xc;
      }
      else {
        uVar11 = (ulong)local_1b8.mc_top;
        local_21c = flags;
        local_218 = dst;
        local_1f0 = (anon_union_8_2_b62042e6_for_mp_p *)pg;
        if (uVar11 != 0) {
          uVar16 = 0;
          do {
            mdb_page_copy(dst,local_1b8.mc_pg[uVar16],(uint)uVar17);
            local_1b8.mc_pg[uVar16] = dst;
            uVar17 = (ulong)pMVar3->me_psize;
            dst = (MDB_page *)((long)dst->mp_ptrs + (uVar17 - 0x10));
            uVar16 = uVar16 + 1;
          } while (uVar11 != uVar16);
        }
        if (uVar9 != 0) {
          local_22c = my->mc_toggle;
          local_21c = local_21c & 4;
          do {
            while( true ) {
              uVar11 = uVar11 & 0xffff;
              local_228 = local_1b8.mc_pg[uVar11];
              uVar13 = (local_228->mp_pb).pb.pb_lower - 0x10;
              uVar14 = uVar13 >> 1;
              if ((local_228->mp_flags & 2) == 0) break;
              if (((local_228->mp_flags & 0x20) == 0 && local_21c == 0) && (1 < uVar13)) {
                uVar17 = 0;
                do {
                  lVar15 = (long)local_228->mp_ptrs + ((ulong)local_228->mp_ptrs[uVar17] - 0x10);
                  uVar12 = *(ushort *)
                            ((long)local_228->mp_ptrs + ((ulong)local_228->mp_ptrs[uVar17] - 0xc));
                  if ((uVar12 & 1) == 0) {
                    if ((uVar12 & 2) != 0) {
                      if (local_228 != dst) {
                        local_1b8.mc_pg[local_1b8.mc_top] = dst;
                        mdb_page_copy(dst,local_228,my->mc_env->me_psize);
                        lVar15 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar17] - 0x10);
                        local_228 = dst;
                      }
                      uVar11 = (ulong)*(ushort *)(lVar15 + 6);
                      puVar2 = (undefined8 *)(lVar15 + 8 + uVar11);
                      local_1e8 = (void *)*puVar2;
                      uStack_1e0 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar15 + 0x18 + uVar11);
                      local_1d8 = *puVar2;
                      uStack_1d0 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar15 + 0x28 + uVar11);
                      local_1c8 = *puVar2;
                      pStack_1c0 = puVar2[1];
                      my->mc_toggle = local_22c;
                      iVar10 = mdb_env_cwalk(my,&pStack_1c0,*(ushort *)(lVar15 + 4) & 4);
                      if (iVar10 != 0) goto LAB_00110530;
                      local_22c = my->mc_toggle;
                      uVar11 = (ulong)*(ushort *)(lVar15 + 6);
                      puVar2 = (undefined8 *)(lVar15 + 0x28 + uVar11);
                      *puVar2 = local_1c8;
                      puVar2[1] = pStack_1c0;
                      puVar2 = (undefined8 *)(lVar15 + 0x18 + uVar11);
                      *puVar2 = local_1d8;
                      puVar2[1] = uStack_1d0;
                      puVar2 = (undefined8 *)(lVar15 + 8 + uVar11);
                      *puVar2 = local_1e8;
                      puVar2[1] = uStack_1e0;
                    }
                  }
                  else {
                    if (local_228 != dst) {
                      local_1b8.mc_pg[local_1b8.mc_top] = dst;
                      mdb_page_copy(dst,local_228,my->mc_env->me_psize);
                      lVar15 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar17] - 0x10);
                      local_228 = dst;
                    }
                    local_200 = lVar15;
                    local_1f8 = uVar17;
                    iVar10 = mdb_page_get((MDB_cursor *)local_1b8.mc_txn,(ulong)local_1b8.mc_flags,
                                          *(MDB_page ***)
                                           (lVar15 + 8 + (ulong)*(ushort *)(lVar15 + 6)),
                                          (int *)&local_1e8);
                    if (iVar10 != 0) goto LAB_00110530;
                    lVar15 = (long)local_22c;
                    iVar10 = my->mc_wlen[lVar15];
                    if (0xfffff < iVar10) {
                      iVar10 = mdb_env_cthr_toggle(my,1);
                      if (iVar10 != 0) goto LAB_00110530;
                      local_22c = my->mc_toggle;
                      lVar15 = (long)local_22c;
                      iVar10 = my->mc_wlen[lVar15];
                    }
                    pvVar8 = local_1e8;
                    pcVar4 = my->mc_wbuf[lVar15];
                    local_210 = pcVar4 + iVar10;
                    local_208 = lVar15;
                    memcpy(local_210,local_1e8,(ulong)my->mc_env->me_psize);
                    pVar5 = my->mc_next_pgno;
                    *(pgno_t *)(pcVar4 + iVar10) = pVar5;
                    my->mc_next_pgno = *(uint *)((long)pvVar8 + 0xc) + pVar5;
                    pMVar3 = my->mc_env;
                    my->mc_wlen[local_208] = my->mc_wlen[local_208] + pMVar3->me_psize;
                    if (1 < *(uint *)((long)pvVar8 + 0xc)) {
                      my->mc_olen[local_208] =
                           (*(uint *)((long)pvVar8 + 0xc) - 1) * pMVar3->me_psize;
                      my->mc_over[local_208] = (char *)((long)pvVar8 + (ulong)pMVar3->me_psize);
                      iVar10 = mdb_env_cthr_toggle(my,1);
                      if (iVar10 != 0) goto LAB_00110530;
                      local_22c = my->mc_toggle;
                    }
                    *(undefined8 *)(local_200 + 8 + (ulong)*(ushort *)(local_200 + 6)) =
                         *(undefined8 *)local_210;
                    uVar17 = local_1f8;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar14 + (uVar14 == 0) != uVar17);
              }
LAB_00110421:
              lVar15 = (long)local_22c;
              iVar10 = my->mc_wlen[lVar15];
              if (0xfffff < iVar10) {
                iVar10 = mdb_env_cthr_toggle(my,1);
                if (iVar10 != 0) goto LAB_00110530;
                local_22c = my->mc_toggle;
                lVar15 = (long)local_22c;
                iVar10 = my->mc_wlen[lVar15];
              }
              pcVar4 = my->mc_wbuf[lVar15];
              pMVar1 = (MDB_page *)(pcVar4 + iVar10);
              mdb_page_copy(pMVar1,local_228,my->mc_env->me_psize);
              pVar5 = my->mc_next_pgno;
              my->mc_next_pgno = pVar5 + 1;
              *(pgno_t *)(pcVar4 + iVar10) = pVar5;
              my->mc_wlen[lVar15] = my->mc_wlen[lVar15] + my->mc_env->me_psize;
              if (local_1b8.mc_top == 0) {
                *local_1f0 = pMVar1->mp_p;
                goto LAB_0011052e;
              }
              pMVar6 = local_1b8.mc_pg[local_1b8.mc_top - 1];
              uVar17 = (ulong)pMVar6->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top - 1]];
              *(undefined2 *)((long)pMVar6->mp_ptrs + (uVar17 - 0x10)) =
                   *(undefined2 *)&pMVar1->mp_p;
              *(undefined2 *)((long)pMVar6->mp_ptrs + (uVar17 - 0xe)) =
                   *(undefined2 *)((long)&pMVar1->mp_p + 2);
              *(undefined2 *)((long)pMVar6->mp_ptrs + (uVar17 - 0xc)) =
                   *(undefined2 *)((long)&pMVar1->mp_p + 4);
              iVar10 = 0;
              if ((local_1b8.mc_snum == 0) ||
                 (local_1b8.mc_snum = local_1b8.mc_snum - 1, iVar10 = 0, local_1b8.mc_snum == 0))
              goto LAB_00110530;
              uVar11 = (ulong)(local_1b8.mc_top - 1);
              local_1b8.mc_top = (unsigned_short)(local_1b8.mc_top - 1);
            }
            uVar12 = local_1b8.mc_ki[uVar11] + 1;
            local_1b8.mc_ki[uVar11] = uVar12;
            if (uVar14 <= uVar12) goto LAB_00110421;
            uVar7 = CONCAT24(*(undefined2 *)
                              ((long)local_228->mp_ptrs + ((ulong)local_228->mp_ptrs[uVar12] - 0xc))
                             ,*(undefined4 *)
                               ((long)local_228->mp_ptrs +
                               ((ulong)local_228->mp_ptrs[uVar12] - 0x10)));
            while( true ) {
              iVar10 = mdb_page_get((MDB_cursor *)local_1b8.mc_txn,(ulong)local_1b8.mc_flags,
                                    (MDB_page **)(ulong)uVar7,(int *)&local_228);
              pMVar1 = local_228;
              if (iVar10 != 0) goto LAB_00110530;
              local_1b8.mc_snum = local_1b8.mc_snum + 1;
              local_1b8.mc_top = local_1b8.mc_top + 1;
              uVar11 = (ulong)local_1b8.mc_top;
              local_1b8.mc_ki[uVar11] = 0;
              if ((local_228->mp_flags & 1) == 0) break;
              mdb_page_copy(local_1b8.mc_pg[uVar11],local_228,my->mc_env->me_psize);
              uVar7 = CONCAT24(*(undefined2 *)
                                ((long)pMVar1->mp_ptrs +
                                ((ulong)pMVar1->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top]] - 0xc)),
                               *(undefined4 *)
                                ((long)pMVar1->mp_ptrs +
                                ((ulong)pMVar1->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top]] - 0x10)))
              ;
            }
            local_1b8.mc_pg[uVar11] = local_228;
          } while (local_1b8.mc_snum != 0);
        }
LAB_0011052e:
        iVar10 = 0;
LAB_00110530:
        free(local_218);
      }
    }
  }
  return iVar10;
}

Assistant:

static int ESECT
mdb_env_cwalk(mdb_copy *my, pgno_t *pg, int flags)
{
	MDB_cursor mc;
	MDB_node *ni;
	MDB_page *mo, *mp, *leaf;
	char *buf, *ptr;
	int rc, toggle;
	unsigned int i;

	/* Empty DB, nothing to do */
	if (*pg == P_INVALID)
		return MDB_SUCCESS;

	mc.mc_snum = 1;
	mc.mc_top = 0;
	mc.mc_txn = my->mc_txn;

	rc = mdb_page_get(&mc, *pg, &mc.mc_pg[0], NULL);
	if (rc)
		return rc;
	rc = mdb_page_search_root(&mc, NULL, MDB_PS_FIRST);
	if (rc)
		return rc;

	/* Make cursor pages writable */
	buf = ptr = malloc(my->mc_env->me_psize * mc.mc_snum);
	if (buf == NULL)
		return ENOMEM;

	for (i=0; i<mc.mc_top; i++) {
		mdb_page_copy((MDB_page *)ptr, mc.mc_pg[i], my->mc_env->me_psize);
		mc.mc_pg[i] = (MDB_page *)ptr;
		ptr += my->mc_env->me_psize;
	}

	/* This is writable space for a leaf page. Usually not needed. */
	leaf = (MDB_page *)ptr;

	toggle = my->mc_toggle;
	while (mc.mc_snum > 0) {
		unsigned n;
		mp = mc.mc_pg[mc.mc_top];
		n = NUMKEYS(mp);

		if (IS_LEAF(mp)) {
			if (!IS_LEAF2(mp) && !(flags & F_DUPDATA)) {
				for (i=0; i<n; i++) {
					ni = NODEPTR(mp, i);
					if (ni->mn_flags & F_BIGDATA) {
						MDB_page *omp;
						pgno_t pg;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&pg, NODEDATA(ni), sizeof(pg));
						rc = mdb_page_get(&mc, pg, &omp, NULL);
						if (rc)
							goto done;
						if (my->mc_wlen[toggle] >= MDB_WBUF) {
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
						memcpy(mo, omp, my->mc_env->me_psize);
						mo->mp_pgno = my->mc_next_pgno;
						my->mc_next_pgno += omp->mp_pages;
						my->mc_wlen[toggle] += my->mc_env->me_psize;
						if (omp->mp_pages > 1) {
							my->mc_olen[toggle] = my->mc_env->me_psize * (omp->mp_pages - 1);
							my->mc_over[toggle] = (char *)omp + my->mc_env->me_psize;
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						memcpy(NODEDATA(ni), &mo->mp_pgno, sizeof(pgno_t));
					} else if (ni->mn_flags & F_SUBDATA) {
						MDB_db db;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&db, NODEDATA(ni), sizeof(db));
						my->mc_toggle = toggle;
						rc = mdb_env_cwalk(my, &db.md_root, ni->mn_flags & F_DUPDATA);
						if (rc)
							goto done;
						toggle = my->mc_toggle;
						memcpy(NODEDATA(ni), &db, sizeof(db));
					}
				}
			}
		} else {
			mc.mc_ki[mc.mc_top]++;
			if (mc.mc_ki[mc.mc_top] < n) {
				pgno_t pg;
again:
				ni = NODEPTR(mp, mc.mc_ki[mc.mc_top]);
				pg = NODEPGNO(ni);
				rc = mdb_page_get(&mc, pg, &mp, NULL);
				if (rc)
					goto done;
				mc.mc_top++;
				mc.mc_snum++;
				mc.mc_ki[mc.mc_top] = 0;
				if (IS_BRANCH(mp)) {
					/* Whenever we advance to a sibling branch page,
					 * we must proceed all the way down to its first leaf.
					 */
					mdb_page_copy(mc.mc_pg[mc.mc_top], mp, my->mc_env->me_psize);
					goto again;
				} else
					mc.mc_pg[mc.mc_top] = mp;
				continue;
			}
		}
		if (my->mc_wlen[toggle] >= MDB_WBUF) {
			rc = mdb_env_cthr_toggle(my, 1);
			if (rc)
				goto done;
			toggle = my->mc_toggle;
		}
		mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
		mdb_page_copy(mo, mp, my->mc_env->me_psize);
		mo->mp_pgno = my->mc_next_pgno++;
		my->mc_wlen[toggle] += my->mc_env->me_psize;
		if (mc.mc_top) {
			/* Update parent if there is one */
			ni = NODEPTR(mc.mc_pg[mc.mc_top-1], mc.mc_ki[mc.mc_top-1]);
			SETPGNO(ni, mo->mp_pgno);
			mdb_cursor_pop(&mc);
		} else {
			/* Otherwise we're done */
			*pg = mo->mp_pgno;
			break;
		}
	}
done:
	free(buf);
	return rc;
}